

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O2

void __thiscall amrex::ErrorRec::~ErrorRec(ErrorRec *this)

{
  ~ErrorRec(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

ErrorRec::~ErrorRec()
{
    delete err_func;
    delete err_func2;
}